

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsequentialiterable.cpp
# Opt level: O2

QVariant * __thiscall
QSequentialConstIterator::operator*(QVariant *__return_storage_ptr__,QSequentialConstIterator *this)

{
  bool bVar1;
  QVariant *result;
  long in_FS_OFFSET;
  QMetaSequence local_38;
  QMetaType local_30;
  QMetaType local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.super_QMetaContainer.d_ptr =
       *(QMetaContainer *)
        (((this->super_QConstIterator<QMetaSequence>).super_QBaseIterator<QMetaSequence>.m_iterable.
          m_pointer.d & 0xfffffffffffffff8) + 0x10);
  local_30 = QMetaSequence::valueMetaType(&local_38);
  *(undefined1 **)((long)&(__return_storage_ptr__->d).data + 0x10) = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(__return_storage_ptr__->d).field_0x18 = &DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).data.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)((long)&(__return_storage_ptr__->d).data + 8) = &DAT_aaaaaaaaaaaaaaaa;
  ::QVariant::QVariant(__return_storage_ptr__,local_30,(void *)0x0);
  local_28.d_ptr = &QtPrivate::QMetaTypeInterfaceWrapper<QVariant>::metaType;
  bVar1 = ::comparesEqual(&local_30,&local_28);
  result = __return_storage_ptr__;
  if (!bVar1) {
    result = (QVariant *)::QVariant::data(__return_storage_ptr__);
  }
  local_28.d_ptr =
       *(QMetaTypeInterface **)
        (((this->super_QConstIterator<QMetaSequence>).super_QBaseIterator<QMetaSequence>.m_iterable.
          m_pointer.d & 0xfffffffffffffff8) + 0x10);
  QMetaSequence::valueAtConstIterator
            ((QMetaSequence *)&local_28,
             (this->super_QConstIterator<QMetaSequence>).super_QBaseIterator<QMetaSequence>.
             m_iterator,result);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QVariant QSequentialConstIterator::operator*() const
{
    return QIterablePrivate::retrieveElement(metaContainer().valueMetaType(), [this](void *dataPtr) {
        metaContainer().valueAtConstIterator(constIterator(), dataPtr);
    });
}